

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O2

void __thiscall
btHashMap<btHashString,_btCollisionObject_*>::insert
          (btHashMap<btHashString,_btCollisionObject_*> *this,btHashString *key,
          btCollisionObject **value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = key->m_hash;
  iVar1 = (this->m_valueArray).m_capacity;
  iVar4 = findIndex(this,key);
  if (iVar4 == -1) {
    iVar4 = (this->m_valueArray).m_size;
    iVar2 = (this->m_valueArray).m_capacity;
    btAlignedObjectArray<btCollisionObject_*>::push_back(&this->m_valueArray,value);
    btAlignedObjectArray<btHashString>::push_back(&this->m_keyArray,key);
    if (iVar2 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar5 = (this->m_valueArray).m_capacity - 1U & key->m_hash;
    }
    else {
      uVar5 = iVar1 - 1U & uVar5;
    }
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar4] = piVar3[(int)uVar5];
    piVar3[(int)uVar5] = iVar4;
  }
  else {
    (this->m_valueArray).m_data[iVar4] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}